

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint32_t sve_zcr_len_for_el_arm(CPUARMState *env,int el)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  uint uVar4;
  
  uVar4 = env[1].btype - 1;
  if (el < 2) {
    uVar1 = (uint)(env->vfp).zcr_el[1] & 0xf;
    if (uVar4 < uVar1) {
      uVar1 = uVar4;
    }
  }
  else {
    uVar1 = uVar4;
    if (el != 2) {
      uVar2 = env->features;
      goto LAB_0057d025;
    }
  }
  uVar2 = env->features;
  uVar4 = uVar1;
  if (((uVar2 >> 0x20 & 1) != 0) && (uVar4 = (uint)(env->vfp).zcr_el[2] & 0xf, uVar1 < uVar4)) {
    uVar4 = uVar1;
  }
LAB_0057d025:
  uVar1 = uVar4;
  if (((uVar2 >> 0x21 & 1) != 0) && (uVar1 = (uint)(env->vfp).zcr_el[3] & 0xf, uVar4 < uVar1)) {
    uVar1 = uVar4;
  }
  uVar1 = uVar1 & 0xf;
  uVar4 = uVar1;
  if (((uint)env[1].daif >> uVar1 & 1) == 0) {
    uVar3 = find_last_bit(&env[1].daif,(ulong)uVar1);
    uVar4 = (uint)uVar3;
    if (uVar1 <= uVar4) {
      __assert_fail("end_len < start_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                    ,0x1636,"uint32_t sve_zcr_get_valid_len(ARMCPU *, uint32_t)");
    }
  }
  return uVar4;
}

Assistant:

uint32_t sve_zcr_len_for_el(CPUARMState *env, int el)
{
    ARMCPU *cpu = env_archcpu(env);
    uint32_t zcr_len = cpu->sve_max_vq - 1;

    if (el <= 1) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[1]);
    }
    if (el <= 2 && arm_feature(env, ARM_FEATURE_EL2)) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[2]);
    }
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        zcr_len = MIN(zcr_len, 0xf & (uint32_t)env->vfp.zcr_el[3]);
    }

    return sve_zcr_get_valid_len(cpu, zcr_len);
}